

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_concat(FuncState *fs,int *l1,int l2)

{
  int pc;
  uint uVar1;
  int iVar2;
  
  if (l2 != -1) {
    if (*l1 != -1) {
      iVar2 = *l1;
      do {
        pc = iVar2;
        uVar1 = fs->f->sp->code[pc] >> 0xe;
        if (uVar1 == 0x1fffe) break;
        iVar2 = uVar1 + pc + -0x1fffe;
      } while (iVar2 != -1);
      fixjump(fs,pc,l2);
      return;
    }
    *l1 = l2;
  }
  return;
}

Assistant:

void luaK_concat (FuncState *fs, int *l1, int l2) {
  if (l2 == NO_JUMP) return;
  else if (*l1 == NO_JUMP)
    *l1 = l2;
  else {
    int list = *l1;
    int next;
    while ((next = getjump(fs, list)) != NO_JUMP)  /* find last element */
      list = next;
    fixjump(fs, list, l2);
  }
}